

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O2

bool __thiscall Refal2::CRuleParser::BeginRule(CRuleParser *this)

{
  TTokenType TVar1;
  allocator local_39;
  string local_38;
  
  TVar1 = (this->functionName).type;
  if (TVar1 == TT_None) {
    (this->super_CQualifierParser).super_CParsingElementState.state = PES_NotFinished;
    std::__cxx11::string::string((string *)&local_38,"try to define rule out of function",&local_39)
    ;
    error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    beginRule(this);
  }
  return TVar1 != TT_None;
}

Assistant:

bool CRuleParser::BeginRule()
{
	if( !functionName.IsNone() ) {
		beginRule();
		return true;
	}
	CParsingElementState::Reset();
	error( "try to define rule out of function" );
	return false;
}